

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

bool __thiscall cmDocumentation::PrintHelpOneModule(cmDocumentation *this,ostream *os)

{
  undefined8 os_00;
  bool bVar1;
  ostream *poVar2;
  string local_60;
  undefined1 local_40 [8];
  string mname;
  ostream *os_local;
  cmDocumentation *this_local;
  
  mname.field_2._8_8_ = os;
  std::__cxx11::string::string((string *)local_40,(string *)&this->CurrentArgument);
  os_00 = mname.field_2._8_8_;
  cmStrCat<char_const(&)[8],std::__cxx11::string&>
            (&local_60,(char (*) [8])"module/",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  bVar1 = PrintFiles(this,(ostream *)os_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)mname.field_2._8_8_,"Argument \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->CurrentArgument);
    std::operator<<(poVar2,"\" to --help-module is not a CMake module.\n");
  }
  std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool cmDocumentation::PrintHelpOneModule(std::ostream& os)
{
  std::string mname = this->CurrentArgument;
  if (this->PrintFiles(os, cmStrCat("module/", mname))) {
    return true;
  }
  // Argument was not a module.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-module is not a CMake module.\n";
  return false;
}